

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O1

int32_t __thiscall icu_63::FCDUIterCollationIterator::getOffset(FCDUIterCollationIterator *this)

{
  UCharIterator *pUVar1;
  int32_t iVar2;
  int iVar3;
  
  if ((int)this->state < 2) {
    pUVar1 = (this->super_UIterCollationIterator).iter;
    iVar2 = (*pUVar1->getIndex)(pUVar1,UITER_CURRENT);
    return iVar2;
  }
  iVar3 = this->pos;
  if (this->state != ITER_IN_FCD_SEGMENT) {
    if (iVar3 == 0) {
      return this->start;
    }
    iVar3 = this->limit;
  }
  return iVar3;
}

Assistant:

int32_t
FCDUIterCollationIterator::getOffset() const {
    if(state <= ITER_CHECK_BWD) {
        return iter.getIndex(&iter, UITER_CURRENT);
    } else if(state == ITER_IN_FCD_SEGMENT) {
        return pos;
    } else if(pos == 0) {
        return start;
    } else {
        return limit;
    }
}